

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_heap.h
# Opt level: O3

void __thiscall merlin::indexed_heap::erase(indexed_heap *this,size_t r)

{
  pointer *ppuVar1;
  double dVar2;
  pointer puVar3;
  size_t i;
  pointer pdVar4;
  pointer pdVar5;
  pointer puVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  size_t sVar9;
  
  puVar3 = (this->m_rev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  i = puVar3[r];
  if (i != 0) {
    pdVar4 = (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar9 = (long)pdVar5 - (long)pdVar4 >> 3;
    if (i != sVar9) {
      dVar2 = pdVar4[i - 1];
      pdVar4[i - 1] = pdVar4[sVar9 - 1];
      pdVar4[sVar9 - 1] = dVar2;
      puVar6 = (this->m_id).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = puVar6[i - 1];
      puVar6[i - 1] = puVar6[sVar9 - 1];
      puVar6[sVar9 - 1] = uVar7;
      uVar8 = puVar3[puVar6[i - 1]];
      puVar3[puVar6[i - 1]] = puVar3[uVar7];
      puVar3[uVar7] = uVar8;
      puVar3[r] = 0;
      (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar5 + -1;
      ppuVar1 = &(this->m_id).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      max_heapify(this,i);
      return;
    }
    puVar3[r] = 0;
    (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar5 + -1;
    ppuVar1 = &(this->m_id).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
  }
  return;
}

Assistant:

void erase(size_t r) {
		size_t I = m_rev[r];
		if (I == 0)
			return;		// already gone
		if (I == size()) {
			m_rev[r] = 0;
			m_p.pop_back();
			m_id.pop_back();
		} else {
			heap_swap(I, size());
			m_rev[r] = 0;
			m_p.pop_back();
			m_id.pop_back();
			max_heapify(I);
		}
	}